

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::BatchNorm_x86_avx512::forward_inplace
          (BatchNorm_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  void *pvVar7;
  long lVar8;
  long lVar9;
  _func_int **pp_Var10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  undefined1 (*pauVar14) [64];
  int iVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [64];
  
  iVar1 = bottom_top_blob->elempack;
  iVar15 = bottom_top_blob->dims;
  iVar2 = bottom_top_blob->w;
  uVar3 = bottom_top_blob->h;
  iVar11 = bottom_top_blob->d;
  uVar4 = bottom_top_blob->c;
  if (iVar15 == 2) {
    iVar12 = iVar1 * iVar2;
    pp_Var10 = this->_vptr_BatchNorm_x86_avx512;
    uVar18 = 0;
    uVar13 = 0;
    if (0 < (int)uVar3) {
      uVar13 = (ulong)uVar3;
    }
    for (; uVar18 != uVar13; uVar18 = uVar18 + 1) {
      lVar8 = *(long *)(&this->field_0x1f8 + (long)pp_Var10[-3]);
      lVar9 = *(long *)(&this->field_0x240 + (long)pp_Var10[-3]);
      uVar5 = *(uint *)(lVar8 + uVar18 * 4);
      uVar6 = *(uint *)(lVar9 + uVar18 * 4);
      if (iVar1 == 4) {
        auVar19 = vbroadcastf32x4_avx512f(*(undefined1 (*) [16])(lVar8 + uVar18 * 0x10));
        auVar21 = *(undefined1 (*) [16])(lVar9 + uVar18 * 0x10);
        auVar23 = auVar19._0_16_;
        auVar27._0_16_ = ZEXT116(0) * auVar23 + ZEXT116(1) * auVar23;
        auVar27._32_32_ = in_ZMM4._32_32_;
        auVar27._16_16_ = ZEXT116(0) * auVar19._16_16_ + ZEXT116(1) * auVar23;
        auVar20 = ZEXT3264(CONCAT1616(auVar21,auVar21));
LAB_0017ee50:
        auVar25 = auVar20._0_32_;
        auVar20 = vinserti64x4_avx512f(auVar20,auVar25,1);
        in_ZMM4 = auVar27;
      }
      else {
        auVar23._4_4_ = uVar5;
        auVar23._0_4_ = uVar5;
        auVar23._8_4_ = uVar5;
        auVar23._12_4_ = uVar5;
        auVar21._4_4_ = uVar6;
        auVar21._0_4_ = uVar6;
        auVar21._8_4_ = uVar6;
        auVar21._12_4_ = uVar6;
        if (iVar1 == 8) {
          auVar19 = vbroadcastf64x4_avx512f(*(undefined1 (*) [32])(lVar8 + uVar18 * 0x20));
          auVar20 = ZEXT3264(*(undefined1 (*) [32])(lVar9 + uVar18 * 0x20));
          auVar27 = ZEXT3264(auVar19._0_32_);
          goto LAB_0017ee50;
        }
        auVar27 = ZEXT3264(CONCAT428(uVar5,CONCAT424(uVar5,CONCAT420(uVar5,CONCAT416(uVar5,CONCAT412
                                                  (uVar5,CONCAT48(uVar5,CONCAT44(uVar5,uVar5))))))))
        ;
        auVar25._4_4_ = uVar6;
        auVar25._0_4_ = uVar6;
        auVar25._8_4_ = uVar6;
        auVar25._12_4_ = uVar6;
        auVar25._16_4_ = uVar6;
        auVar25._20_4_ = uVar6;
        auVar25._24_4_ = uVar6;
        auVar25._28_4_ = uVar6;
        auVar20 = ZEXT3264(auVar25);
        if (iVar1 != 0x10) {
          auVar19 = vpbroadcastd_avx512f(auVar23);
          goto LAB_0017ee50;
        }
        auVar19 = vmovdqu64_avx512f(*(undefined1 (*) [64])(lVar8 + uVar18 * 0x40));
        auVar20 = vmovdqu64_avx512f(*(undefined1 (*) [64])(lVar9 + uVar18 * 0x40));
        in_ZMM4 = auVar27;
      }
      pauVar14 = (undefined1 (*) [64])
                 ((long)bottom_top_blob->w * uVar18 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      for (iVar17 = 0; iVar17 + 0xf < iVar12; iVar17 = iVar17 + 0x10) {
        auVar27 = vfmadd132ps_avx512f(*pauVar14,auVar19,auVar20);
        *pauVar14 = auVar27;
        pauVar14 = pauVar14 + 1;
      }
      for (; iVar17 + 7 < iVar12; iVar17 = iVar17 + 8) {
        auVar22 = vfmadd132ps_fma(*(undefined1 (*) [32])*pauVar14,in_ZMM4._0_32_,auVar25);
        *(undefined1 (*) [32])*pauVar14 = ZEXT1632(auVar22);
        pauVar14 = (undefined1 (*) [64])(*pauVar14 + 0x20);
      }
      for (; iVar17 + 3 < iVar12; iVar17 = iVar17 + 4) {
        auVar22 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar14,auVar23,auVar21);
        in_ZMM4 = ZEXT1664(auVar22);
        *(undefined1 (*) [16])*pauVar14 = auVar22;
        pauVar14 = (undefined1 (*) [64])(*pauVar14 + 0x10);
      }
      for (; iVar17 < iVar12; iVar17 = iVar17 + 1) {
        auVar21 = vfmadd132ss_fma(ZEXT416(*(uint *)*pauVar14),ZEXT416(uVar5),ZEXT416(uVar6));
        *(int *)*pauVar14 = auVar21._0_4_;
        pauVar14 = (undefined1 (*) [64])(*pauVar14 + 4);
      }
    }
  }
  else if (iVar15 == 1) {
    pvVar7 = bottom_top_blob->data;
    lVar8 = *(long *)(&this->field_0x1f8 + (long)this->_vptr_BatchNorm_x86_avx512[-3]);
    lVar9 = *(long *)(&this->field_0x240 + (long)this->_vptr_BatchNorm_x86_avx512[-3]);
    iVar12 = iVar1 * iVar2;
    for (uVar18 = 0; (int)uVar18 + 0xf < iVar12; uVar18 = uVar18 + 0x10) {
      auVar19 = vfmadd213ps_avx512f(*(undefined1 (*) [64])(lVar9 + uVar18 * 4),
                                    *(undefined1 (*) [64])((long)pvVar7 + uVar18 * 4),
                                    *(undefined1 (*) [64])(lVar8 + uVar18 * 4));
      *(undefined1 (*) [64])((long)pvVar7 + uVar18 * 4) = auVar19;
    }
    for (; (int)uVar18 + 7 < iVar12; uVar18 = uVar18 + 8) {
      auVar21 = vfmadd213ps_fma(*(undefined1 (*) [32])(lVar9 + uVar18 * 4),
                                *(undefined1 (*) [32])((long)pvVar7 + uVar18 * 4),
                                *(undefined1 (*) [32])(lVar8 + uVar18 * 4));
      *(undefined1 (*) [32])((long)pvVar7 + uVar18 * 4) = ZEXT1632(auVar21);
    }
    for (; (int)uVar18 + 3 < iVar12; uVar18 = uVar18 + 4) {
      auVar21 = vfmadd213ps_fma(*(undefined1 (*) [16])(lVar9 + uVar18 * 4),
                                *(undefined1 (*) [16])((long)pvVar7 + uVar18 * 4),
                                *(undefined1 (*) [16])(lVar8 + uVar18 * 4));
      *(undefined1 (*) [16])((long)pvVar7 + uVar18 * 4) = auVar21;
    }
    lVar16 = 0;
    for (uVar13 = uVar18 & 0xffffffff; (int)uVar13 < iVar12; uVar13 = (ulong)((int)uVar13 + 1)) {
      auVar21 = vfmadd213ss_fma(ZEXT416(*(uint *)((long)pvVar7 + uVar18 * 4 + lVar16)),
                                ZEXT416(*(uint *)(lVar9 + lVar16 + uVar18 * 4)),
                                ZEXT416(*(uint *)(lVar8 + lVar16 + uVar18 * 4)));
      *(int *)((long)pvVar7 + uVar18 * 4 + lVar16) = auVar21._0_4_;
      lVar16 = lVar16 + 4;
    }
  }
  if (iVar15 - 3U < 2) {
    iVar11 = iVar2 * iVar1 * uVar3 * iVar11;
    pp_Var10 = this->_vptr_BatchNorm_x86_avx512;
    uVar13 = 0;
    uVar18 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar18 = uVar13;
    }
    for (; uVar13 != uVar18; uVar13 = uVar13 + 1) {
      lVar8 = *(long *)(&this->field_0x1f8 + (long)pp_Var10[-3]);
      lVar9 = *(long *)(&this->field_0x240 + (long)pp_Var10[-3]);
      uVar3 = *(uint *)(lVar8 + uVar13 * 4);
      uVar4 = *(uint *)(lVar9 + uVar13 * 4);
      if (iVar1 == 4) {
        auVar19 = vbroadcastf32x4_avx512f(*(undefined1 (*) [16])(lVar8 + uVar13 * 0x10));
        auVar22 = *(undefined1 (*) [16])(lVar9 + uVar13 * 0x10);
        auVar24 = auVar19._0_16_;
        auVar20._0_16_ = ZEXT116(0) * auVar24 + ZEXT116(1) * auVar24;
        auVar20._32_32_ = in_ZMM4._32_32_;
        auVar20._16_16_ = ZEXT116(0) * auVar19._16_16_ + ZEXT116(1) * auVar24;
        auVar27 = ZEXT3264(CONCAT1616(auVar22,auVar22));
LAB_0017efd1:
        auVar26 = auVar27._0_32_;
        auVar27 = vinserti64x4_avx512f(auVar27,auVar26,1);
        in_ZMM4 = auVar20;
      }
      else {
        auVar24._4_4_ = uVar3;
        auVar24._0_4_ = uVar3;
        auVar24._8_4_ = uVar3;
        auVar24._12_4_ = uVar3;
        auVar22._4_4_ = uVar4;
        auVar22._0_4_ = uVar4;
        auVar22._8_4_ = uVar4;
        auVar22._12_4_ = uVar4;
        if (iVar1 == 8) {
          auVar19 = vbroadcastf64x4_avx512f(*(undefined1 (*) [32])(lVar8 + uVar13 * 0x20));
          auVar27 = ZEXT3264(*(undefined1 (*) [32])(lVar9 + uVar13 * 0x20));
          auVar20 = ZEXT3264(auVar19._0_32_);
          goto LAB_0017efd1;
        }
        auVar20 = ZEXT3264(CONCAT428(uVar3,CONCAT424(uVar3,CONCAT420(uVar3,CONCAT416(uVar3,CONCAT412
                                                  (uVar3,CONCAT48(uVar3,CONCAT44(uVar3,uVar3))))))))
        ;
        auVar26._4_4_ = uVar4;
        auVar26._0_4_ = uVar4;
        auVar26._8_4_ = uVar4;
        auVar26._12_4_ = uVar4;
        auVar26._16_4_ = uVar4;
        auVar26._20_4_ = uVar4;
        auVar26._24_4_ = uVar4;
        auVar26._28_4_ = uVar4;
        auVar27 = ZEXT3264(auVar26);
        if (iVar1 != 0x10) {
          auVar19 = vpbroadcastd_avx512f(auVar24);
          goto LAB_0017efd1;
        }
        auVar19 = vmovdqu64_avx512f(*(undefined1 (*) [64])(lVar8 + uVar13 * 0x40));
        auVar27 = vmovdqu64_avx512f(*(undefined1 (*) [64])(lVar9 + uVar13 * 0x40));
        in_ZMM4 = auVar20;
      }
      pauVar14 = (undefined1 (*) [64])
                 (bottom_top_blob->cstep * uVar13 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      for (iVar15 = 0; iVar15 + 0xf < iVar11; iVar15 = iVar15 + 0x10) {
        auVar20 = vfmadd132ps_avx512f(*pauVar14,auVar19,auVar27);
        *pauVar14 = auVar20;
        pauVar14 = pauVar14 + 1;
      }
      for (; iVar15 + 7 < iVar11; iVar15 = iVar15 + 8) {
        auVar21 = vfmadd132ps_fma(*(undefined1 (*) [32])*pauVar14,in_ZMM4._0_32_,auVar26);
        *(undefined1 (*) [32])*pauVar14 = ZEXT1632(auVar21);
        pauVar14 = (undefined1 (*) [64])(*pauVar14 + 0x20);
      }
      for (; iVar15 + 3 < iVar11; iVar15 = iVar15 + 4) {
        auVar21 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar14,auVar24,auVar22);
        in_ZMM4 = ZEXT1664(auVar21);
        *(undefined1 (*) [16])*pauVar14 = auVar21;
        pauVar14 = (undefined1 (*) [64])(*pauVar14 + 0x10);
      }
      for (; iVar15 < iVar11; iVar15 = iVar15 + 1) {
        auVar21 = vfmadd132ss_fma(ZEXT416(*(uint *)*pauVar14),ZEXT416(uVar3),ZEXT416(uVar4));
        *(int *)*pauVar14 = auVar21._0_4_;
        pauVar14 = (undefined1 (*) [64])(*pauVar14 + 4);
      }
    }
  }
  return 0;
}

Assistant:

int BatchNorm_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int c = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        float* ptr = bottom_top_blob;
        const float* aptr = a_data;
        const float* bptr = b_data;

        const int size = w * elempack;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p512 = _mm512_loadu_ps(ptr);
            __m512 _a512 = _mm512_loadu_ps(aptr);
            __m512 _b512 = _mm512_loadu_ps(bptr);
            _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
            _mm512_storeu_ps(ptr, _p512);
            ptr += 16;
            aptr += 16;
            bptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p256 = _mm256_loadu_ps(ptr);
            __m256 _a256 = _mm256_loadu_ps(aptr);
            __m256 _b256 = _mm256_loadu_ps(bptr);
            _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
            _mm256_storeu_ps(ptr, _p256);
            ptr += 8;
            aptr += 8;
            bptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p128 = _mm_loadu_ps(ptr);
            __m128 _a128 = _mm_loadu_ps(aptr);
            __m128 _b128 = _mm_loadu_ps(bptr);
            _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
            _mm_storeu_ps(ptr, _p128);
            ptr += 4;
            aptr += 4;
            bptr += 4;
        }
#endif // __SSE__
        for (; i < size; i++)
        {
            *ptr = *bptr * *ptr + *aptr;
            ptr++;
            aptr++;
            bptr++;
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float a = a_data[i];
            float b = b_data[i];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + i * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + i * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; j < size; j++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        const int size = w * h * d * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float a = a_data[q];
            float b = b_data[q];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + q * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + q * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; i < size; i++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    return 0;
}